

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::on_key_down(Dialog *this,ALLEGRO_KEYBOARD_EVENT *event)

{
  long in_RSI;
  Dialog *in_RDI;
  
  if (*(ALLEGRO_DISPLAY **)(in_RSI + 0x18) == in_RDI->display) {
    if (*(int *)(in_RSI + 0x20) == 0x3b) {
      request_quit(in_RDI);
    }
    if (in_RDI->key_widget != (Widget *)0x0) {
      (*in_RDI->key_widget->_vptr_Widget[0xd])(in_RDI->key_widget,in_RSI);
    }
  }
  return;
}

Assistant:

void Dialog::on_key_down(const ALLEGRO_KEYBOARD_EVENT & event)
{
   if (event.display != this->display) {
      return;
   }

   // XXX think of something better when we need it
   if (event.keycode == ALLEGRO_KEY_ESCAPE) {
      this->request_quit();
   }

   if (this->key_widget) {
      this->key_widget->on_key_down(event);
   }
}